

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O1

subtree_ref_base<false> * __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::subtree_ref_base<false>::child
          (subtree_ref_base<false> *__return_storage_ptr__,subtree_ref_base<false> *this,size_t k)

{
  bt_impl_t *pbVar1;
  size_t sVar2;
  word_type wVar3;
  word_type wVar4;
  word_type wVar5;
  size_t sVar6;
  long lVar7;
  size_t begin;
  word_type wVar8;
  
  pbVar1 = this->_vector;
  sVar2 = (pbVar1->pointers)._width;
  lVar7 = (pbVar1->degree + 1) * this->_index;
  wVar3 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::get
                    (&(pbVar1->pointers)._bits,(lVar7 + k) * sVar2,(lVar7 + 1 + k) * sVar2);
  pbVar1 = this->_vector;
  sVar2 = this->_height;
  if (k == 0) {
    sVar6 = (pbVar1->sizes)._width;
    lVar7 = pbVar1->degree * this->_index;
    wVar8 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::get
                      (&(pbVar1->sizes)._bits,sVar6 * lVar7,(lVar7 + 1) * sVar6);
  }
  else {
    sVar6 = pbVar1->degree;
    if (sVar6 == k) {
      lVar7 = sVar6 * this->_index;
      wVar8 = this->_size;
      sVar6 = (pbVar1->sizes)._width;
    }
    else {
      lVar7 = sVar6 * this->_index;
      sVar6 = (pbVar1->sizes)._width;
      wVar8 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
              get(&(pbVar1->sizes)._bits,(lVar7 + k) * sVar6,(lVar7 + 1 + k) * sVar6);
      pbVar1 = this->_vector;
      sVar6 = (pbVar1->sizes)._width;
      lVar7 = pbVar1->degree * this->_index;
    }
    wVar4 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::get
                      (&(pbVar1->sizes)._bits,(lVar7 + -1 + k) * sVar6,(lVar7 + k) * sVar6);
    wVar8 = wVar8 - wVar4;
  }
  pbVar1 = this->_vector;
  if (k == 0) {
    sVar6 = (pbVar1->ranks)._width;
    lVar7 = pbVar1->degree * this->_index;
    wVar4 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::get
                      (&(pbVar1->ranks)._bits,sVar6 * lVar7,(lVar7 + 1) * sVar6);
  }
  else {
    sVar6 = pbVar1->degree;
    if (sVar6 == k) {
      lVar7 = sVar6 * this->_index;
      wVar4 = this->_rank;
      sVar6 = (pbVar1->ranks)._width;
      begin = (lVar7 + -1 + k) * sVar6;
      sVar6 = (lVar7 + k) * sVar6;
    }
    else {
      lVar7 = sVar6 * this->_index;
      sVar6 = (pbVar1->ranks)._width;
      wVar4 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::
              get(&(pbVar1->ranks)._bits,(lVar7 + k) * sVar6,(lVar7 + 1 + k) * sVar6);
      pbVar1 = this->_vector;
      sVar6 = (pbVar1->ranks)._width;
      lVar7 = pbVar1->degree * this->_index;
      begin = (lVar7 + -1 + k) * sVar6;
      sVar6 = (lVar7 + k) * sVar6;
    }
    wVar5 = bitview<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>::get
                      (&(pbVar1->ranks)._bits,begin,sVar6);
    wVar4 = wVar4 - wVar5;
  }
  __return_storage_ptr__->_vector = this->_vector;
  __return_storage_ptr__->_index = wVar3;
  __return_storage_ptr__->_height = sVar2 - 1;
  __return_storage_ptr__->_size = wVar8;
  __return_storage_ptr__->_rank = wVar4;
  return __return_storage_ptr__;
}

Assistant:

subtree_ref_base child(size_t k) const
            {
                assert(is_node());
                assert(k <= degree());
                assert(pointers(k) != 0);
                
                size_t p = pointers(k);
                size_t h = height() - 1;
                
                // Size of the subtree
                size_t s = k == 0        ? sizes(k) :
                           k == degree() ? size()   - sizes(k - 1) :
                                           sizes(k) - sizes(k - 1);
                
                // Rank of the subtree
                size_t r = k == 0        ? ranks(k) :
                           k == degree() ? rank()   - ranks(k - 1) :
                                           ranks(k) - ranks(k - 1);
                
                return { _vector, p, h, s, r };
            }